

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<test_result_(bool)>::FunctionMockerBase
          (FunctionMockerBase<test_result_(bool)> *this)

{
  UntypedFunctionMockerBase *in_RDI;
  FunctionMockerBase<test_result_(bool)> *in_stack_ffffffffffffffd8;
  
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(in_RDI);
  in_RDI->_vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_00265b78;
  MockSpec<test_result_(bool)>::MockSpec
            ((MockSpec<test_result_(bool)> *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}